

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# idl_parser.cpp
# Opt level: O1

bool __thiscall flatbuffers::StructDef::Deserialize(StructDef *this,Parser *parser,Object *object)

{
  SymbolTable<flatbuffers::Value> *attributes;
  pointer pcVar1;
  long lVar2;
  long lVar3;
  bool bVar4;
  bool bVar5;
  ushort uVar6;
  int iVar7;
  const_iterator cVar8;
  FieldDef *this_00;
  size_t sVar9;
  ulong uVar10;
  Object *pOVar11;
  size_t sVar12;
  byte bVar13;
  uint uVar14;
  Vector<flatbuffers::Offset<reflection::KeyValue>,_unsigned_int> *attrs;
  int iVar15;
  Vector<flatbuffers::Offset<flatbuffers::String>,_unsigned_int> *documentation;
  ulong uVar16;
  Object *pOVar17;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar18;
  vector<unsigned_int,_std::allocator<unsigned_int>_> indexes;
  string local_a0;
  StructDef *local_80;
  long local_78;
  Parser *local_70;
  Object *local_68;
  Object *local_60;
  SymbolTable<flatbuffers::FieldDef> *local_58;
  string local_50;
  
  if (*(ushort *)(object + -(long)*(int *)object) < 0xf) {
    uVar6 = 0;
  }
  else {
    uVar6 = *(ushort *)(object + (0xe - (long)*(int *)object));
  }
  if (uVar6 == 0) {
    attrs = (Vector<flatbuffers::Offset<reflection::KeyValue>,_unsigned_int> *)0x0;
  }
  else {
    attrs = (Vector<flatbuffers::Offset<reflection::KeyValue>,_unsigned_int> *)
            (object + (ulong)*(uint *)(object + uVar6) + (ulong)uVar6);
  }
  attributes = &(this->super_Definition).attributes;
  local_70 = parser;
  bVar4 = DeserializeAttributesCommon(attributes,parser,attrs);
  if (bVar4) {
    if (*(ushort *)(object + -(long)*(int *)object) < 0x11) {
      uVar6 = 0;
    }
    else {
      uVar6 = *(ushort *)(object + (0x10 - (long)*(int *)object));
    }
    if (uVar6 == 0) {
      documentation = (Vector<flatbuffers::Offset<flatbuffers::String>,_unsigned_int> *)0x0;
    }
    else {
      documentation =
           (Vector<flatbuffers::Offset<flatbuffers::String>,_unsigned_int> *)
           (object + (ulong)*(uint *)(object + uVar6) + (ulong)uVar6);
    }
    anon_unknown_0::DeserializeDoc(&(this->super_Definition).doc_comment,documentation);
    if (*(ushort *)(object + -(long)*(int *)object) < 5) {
      uVar6 = 0;
    }
    else {
      uVar6 = *(ushort *)(object + (4 - (long)*(int *)object));
    }
    uVar16 = (ulong)uVar6;
    local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_50,object + *(uint *)(object + uVar16) + uVar16 + 4,
               object + (ulong)*(uint *)(object + *(uint *)(object + uVar16) + uVar16) +
                        *(uint *)(object + uVar16) + uVar16 + 4);
    Parser::UnqualifiedName(&local_a0,local_70,&local_50);
    std::__cxx11::string::operator=((string *)this,(string *)&local_a0);
    paVar18 = &local_a0.field_2;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_a0._M_dataplus._M_p != paVar18) {
      operator_delete(local_a0._M_dataplus._M_p,local_a0.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_50._M_dataplus._M_p != &local_50.field_2) {
      operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
    }
    this->predecl = false;
    local_a0._M_dataplus._M_p = (pointer)paVar18;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_a0,"original_order","");
    cVar8 = std::
            _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_flatbuffers::Value_*>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_flatbuffers::Value_*>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_flatbuffers::Value_*>_>_>
            ::find((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_flatbuffers::Value_*>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_flatbuffers::Value_*>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_flatbuffers::Value_*>_>_>
                    *)attributes,&local_a0);
    if ((_Rb_tree_header *)cVar8._M_node ==
        &(this->super_Definition).attributes.dict._M_t._M_impl.super__Rb_tree_header) {
      bVar4 = true;
    }
    else {
      bVar4 = *(long *)(cVar8._M_node + 2) == 0;
    }
    bVar13 = false;
    if (bVar4) {
      bVar13 = this->fixed ^ 1;
    }
    this->sortbysize = (bool)bVar13;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_a0._M_dataplus._M_p != paVar18) {
      operator_delete(local_a0._M_dataplus._M_p,local_a0.field_2._M_allocated_capacity + 1);
    }
    if (*(ushort *)(object + -(long)*(int *)object) < 7) {
      uVar6 = 0;
    }
    else {
      uVar6 = *(ushort *)(object + (6 - (long)*(int *)object));
    }
    if (uVar6 == 0) {
      pOVar17 = (Object *)0x0;
    }
    else {
      pOVar17 = object + (ulong)*(uint *)(object + uVar6) + (ulong)uVar6;
    }
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
              ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)&local_a0,
               (ulong)*(uint *)pOVar17,(allocator_type *)&local_50);
    if (*(uint *)pOVar17 != 0) {
      uVar14 = 0;
      uVar16 = 0;
      do {
        lVar2 = (ulong)uVar14 + 4;
        lVar3 = (ulong)*(uint *)(pOVar17 + (ulong)uVar14 + 4) + lVar2;
        if (*(ushort *)
             (pOVar17 +
             (lVar3 - *(int *)(pOVar17 + (ulong)*(uint *)(pOVar17 + (ulong)uVar14 + 4) + lVar2))) <
            9) {
          uVar6 = 0;
        }
        else {
          uVar6 = *(ushort *)
                   (pOVar17 +
                   ((lVar3 + 8) -
                   (long)*(int *)(pOVar17 + (ulong)*(uint *)(pOVar17 + (ulong)uVar14 + 4) + lVar2)))
          ;
        }
        if (uVar6 == 0) {
          uVar10 = 0;
        }
        else {
          uVar10 = (ulong)*(ushort *)(pOVar17 + (ulong)uVar6 + lVar3);
        }
        *(int *)(local_a0._M_dataplus._M_p + uVar10 * 4) = (int)uVar16;
        uVar16 = uVar16 + 1;
        uVar14 = uVar14 + 4;
      } while (uVar16 < *(uint *)pOVar17);
    }
    bVar4 = (pointer)local_a0._M_string_length == local_a0._M_dataplus._M_p;
    local_80 = this;
    if (bVar4) {
      iVar15 = 0;
    }
    else {
      local_68 = pOVar17 + 4;
      local_58 = &this->fields;
      uVar16 = 0;
      local_78 = 0;
      local_60 = object;
      do {
        if (*(uint *)pOVar17 <= *(uint *)(local_a0._M_dataplus._M_p + uVar16 * 4))
        goto LAB_00120a64;
        uVar10 = (ulong)(*(uint *)(local_a0._M_dataplus._M_p + uVar16 * 4) << 2);
        uVar14 = *(uint *)(local_68 + uVar10);
        this_00 = (FieldDef *)operator_new(0x138);
        FieldDef::FieldDef(this_00);
        bVar5 = FieldDef::Deserialize(this_00,local_70,(Field *)(local_68 + uVar14 + uVar10));
        if ((!bVar5) ||
           (bVar5 = SymbolTable<flatbuffers::FieldDef>::Add(local_58,(string *)this_00,this_00),
           bVar5)) {
LAB_00120850:
          pcVar1 = (this_00->value).constant._M_dataplus._M_p;
          paVar18 = &(this_00->value).constant.field_2;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)pcVar1 != paVar18) {
            operator_delete(pcVar1,paVar18->_M_allocated_capacity + 1);
          }
          SymbolTable<flatbuffers::Value>::~SymbolTable(&(this_00->super_Definition).attributes);
          std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::~vector(&(this_00->super_Definition).doc_comment);
          pcVar1 = (this_00->super_Definition).file._M_dataplus._M_p;
          paVar18 = &(this_00->super_Definition).file.field_2;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)pcVar1 != paVar18) {
            operator_delete(pcVar1,paVar18->_M_allocated_capacity + 1);
          }
          pcVar1 = (this_00->super_Definition).name._M_dataplus._M_p;
          paVar18 = &(this_00->super_Definition).name.field_2;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)pcVar1 != paVar18) {
            operator_delete(pcVar1,paVar18->_M_allocated_capacity + 1);
          }
          operator_delete(this_00,0x138);
          bVar5 = false;
        }
        else {
          if (this_00->key == true) {
            if (local_80->has_key == true) goto LAB_00120850;
            local_80->has_key = true;
          }
          bVar5 = true;
          if (local_80->fixed == true) {
            sVar9 = InlineSize(&(this_00->value).type);
            if (uVar16 + 1 <
                (ulong)((long)(local_a0._M_string_length - (long)local_a0._M_dataplus._M_p) >> 2)) {
              if (*(uint *)pOVar17 <= *(uint *)(local_a0._M_dataplus._M_p + uVar16 * 4 + 4)) {
LAB_00120a64:
                __assert_fail("i < size()",
                              "/workspace/llm4binary/github/license_all_cmakelists_25/aardappel[P]flatbuffers/include/flatbuffers/vector.h"
                              ,0xc1,
                              "return_type flatbuffers::Vector<flatbuffers::Offset<reflection::Field>>::Get(SizeT) const [T = flatbuffers::Offset<reflection::Field>, SizeT = unsigned int]"
                             );
              }
              uVar10 = (ulong)(*(uint *)(local_a0._M_dataplus._M_p + uVar16 * 4 + 4) << 2);
              pOVar11 = local_68 + *(uint *)(local_68 + uVar10) + uVar10;
            }
            else {
              pOVar11 = (Object *)0x0;
            }
            if (pOVar11 == (Object *)0x0) {
              sVar12 = local_80->minalign - 1 & -(local_78 + sVar9);
            }
            else {
              if (*(ushort *)(pOVar11 + -(long)*(int *)pOVar11) < 0xb) {
                uVar6 = 0;
              }
              else {
                uVar6 = *(ushort *)(pOVar11 + (10 - (long)*(int *)pOVar11));
              }
              if (uVar6 == 0) {
                uVar10 = 0;
              }
              else {
                uVar10 = (ulong)*(ushort *)(pOVar11 + uVar6);
              }
              sVar12 = uVar10 - (sVar9 + (this_00->value).offset);
            }
            this_00->padding = sVar12;
            local_78 = local_78 + sVar9 + sVar12;
            bVar5 = true;
          }
        }
        if (!bVar5) break;
        uVar16 = uVar16 + 1;
        bVar5 = uVar16 < (ulong)((long)(local_a0._M_string_length - (long)local_a0._M_dataplus._M_p)
                                >> 2);
        bVar4 = !bVar5;
      } while (bVar5);
      iVar15 = (int)local_78;
      object = local_60;
    }
    if (bVar4 != false) {
      iVar7 = 0;
      uVar6 = 0;
      if (0xc < *(ushort *)(object + -(long)*(int *)object)) {
        uVar6 = *(ushort *)(object + (0xc - (long)*(int *)object));
      }
      if (uVar6 != 0) {
        iVar7 = *(int *)(object + uVar6);
      }
      if (iVar7 != iVar15) {
        __assert_fail("static_cast<int>(tmp_struct_size) == object->bytesize()",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/aardappel[P]flatbuffers/src/idl_parser.cpp"
                      ,0xfc0,
                      "bool flatbuffers::StructDef::Deserialize(Parser &, const reflection::Object *)"
                     );
      }
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_a0._M_dataplus._M_p !=
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)0x0) {
      operator_delete(local_a0._M_dataplus._M_p,
                      local_a0.field_2._M_allocated_capacity - (long)local_a0._M_dataplus._M_p);
    }
  }
  else {
    bVar4 = false;
  }
  return bVar4;
}

Assistant:

bool StructDef::Deserialize(Parser &parser, const reflection::Object *object) {
  if (!DeserializeAttributes(parser, object->attributes())) return false;
  DeserializeDoc(doc_comment, object->documentation());
  name = parser.UnqualifiedName(object->name()->str());
  predecl = false;
  sortbysize = attributes.Lookup("original_order") == nullptr && !fixed;
  const auto &of = *(object->fields());
  auto indexes = std::vector<uoffset_t>(of.size());
  for (uoffset_t i = 0; i < of.size(); i++) indexes[of.Get(i)->id()] = i;
  size_t tmp_struct_size = 0;
  for (size_t i = 0; i < indexes.size(); i++) {
    auto field = of.Get(indexes[i]);
    auto field_def = new FieldDef();
    if (!field_def->Deserialize(parser, field) ||
        fields.Add(field_def->name, field_def)) {
      delete field_def;
      return false;
    }
    if (field_def->key) {
      if (has_key) {
        // only one field may be set as key
        delete field_def;
        return false;
      }
      has_key = true;
    }
    if (fixed) {
      // Recompute padding since that's currently not serialized.
      auto size = InlineSize(field_def->value.type);
      auto next_field =
          i + 1 < indexes.size() ? of.Get(indexes[i + 1]) : nullptr;
      tmp_struct_size += size;
      field_def->padding =
          next_field ? (next_field->offset() - field_def->value.offset) - size
                     : PaddingBytes(tmp_struct_size, minalign);
      tmp_struct_size += field_def->padding;
    }
  }
  FLATBUFFERS_ASSERT(static_cast<int>(tmp_struct_size) == object->bytesize());
  return true;
}